

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferObjectQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_2::BufferMappedCase::testBuffer(BufferMappedCase *this)

{
  CallLogWrapper *this_00;
  BufferParamVerifier *pBVar1;
  
  pBVar1 = (this->super_BufferCase).m_verifier;
  (*pBVar1->_vptr_BufferParamVerifier[2])
            (pBVar1,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x88bc,0
            );
  this_00 = &(this->super_BufferCase).super_ApiCase.super_CallLogWrapper;
  glu::CallLogWrapper::glBufferData
            (this_00,(this->super_BufferCase).m_bufferTarget,0x10,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glMapBufferRange(this_00,(this->super_BufferCase).m_bufferTarget,0,0x10,2);
  ApiCase::expectError((ApiCase *)this,0);
  pBVar1 = (this->super_BufferCase).m_verifier;
  (*pBVar1->_vptr_BufferParamVerifier[2])
            (pBVar1,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x88bc,1
            );
  ApiCase::expectError((ApiCase *)this,0);
  glu::CallLogWrapper::glUnmapBuffer(this_00,(this->super_BufferCase).m_bufferTarget);
  ApiCase::expectError((ApiCase *)this,0);
  return;
}

Assistant:

void testBuffer (void)
	{
		m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_MAPPED, GL_FALSE);

		glBufferData(m_bufferTarget, 16, DE_NULL, GL_DYNAMIC_COPY);
		glMapBufferRange(m_bufferTarget, 0, 16, GL_MAP_WRITE_BIT);
		expectError(GL_NO_ERROR);

		m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_MAPPED, GL_TRUE);
		expectError(GL_NO_ERROR);

		glUnmapBuffer(m_bufferTarget);
		expectError(GL_NO_ERROR);
	}